

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

string_type * __thiscall
booster::locale::impl_icu::number_format<char>::format_abi_cxx11_
          (string_type *__return_storage_ptr__,number_format<char> *this,int32_t value,
          size_t *code_points)

{
  int iVar1;
  UnicodeString tmp;
  code *local_58;
  undefined2 local_50;
  
  local_58 = std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname;
  local_50 = 2;
  icu_70::NumberFormat::format((int)this->icu_fmt_,(UnicodeString *)(ulong)(uint)value);
  iVar1 = icu_70::UnicodeString::countChar32((int)&local_58,0);
  *code_points = (long)iVar1;
  icu_std_converter<char,1>::std_abi_cxx11_
            (__return_storage_ptr__,&this->cvt_,(UnicodeString *)&local_58);
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

virtual string_type format(int32_t value,size_t &code_points) const
            {
                icu::UnicodeString tmp;
                #ifdef __SUNPRO_CC 
                icu_fmt_->format(static_cast<int>(value),tmp);
                #else
                icu_fmt_->format(::int32_t(value),tmp);
                #endif
                code_points=tmp.countChar32();
                return cvt_.std(tmp);
            }